

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDParameters.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::RNEMDParameters::validate(RNEMDParameters *this)

{
  bool bVar1;
  int data;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RDI;
  double data_00;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffff5438;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *pPVar4;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_ffffffffffff5440;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *this_00;
  allocator<char> *in_stack_ffffffffffff5470;
  allocator<char> *__a;
  string *in_stack_ffffffffffff5478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff5480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff54c0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_ffffffffffff54c8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff54d0;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff54d8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5530;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5538;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5590;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons2;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5598;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff55f0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff55f8;
  undefined6 in_stack_ffffffffffff5650;
  byte in_stack_ffffffffffff5656;
  undefined1 in_stack_ffffffffffff5657;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5658;
  undefined1 local_a991 [65];
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff56b0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff56b8;
  allocator<char> local_a929;
  string local_a928 [56];
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5710;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5718;
  allocator<char> local_a8c1;
  string local_a8c0 [48];
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5770;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5778;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff57d0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff57d8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5830;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5838;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5890;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5898;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff58f0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff58f8;
  string local_a6c0 [16];
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5950;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5958;
  string local_a6a0 [39];
  allocator<char> local_a679;
  string local_a678 [40];
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff59b0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff59b8;
  allocator<char> local_a611;
  string local_a610 [32];
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5a10;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5a18;
  allocator<char> local_a5a9;
  string local_a5a8 [24];
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5a70;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5a78;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5ad0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5ad8;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffff5b30;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffff5b38;
  undefined1 local_a3a1 [104];
  undefined1 local_a339 [104];
  allocator<char> local_a2d1;
  string local_a2d0 [103];
  allocator<char> local_a269;
  string local_a268 [103];
  allocator<char> local_a201;
  string local_a200 [103];
  allocator<char> local_a199;
  string local_a198 [103];
  allocator<char> local_a131;
  string local_a130 [103];
  allocator<char> local_a0c9;
  string local_a0c8 [103];
  allocator<char> local_a061;
  string local_a060 [103];
  undefined1 local_9ff9 [104];
  undefined1 local_9f91 [104];
  undefined1 local_9f29 [104];
  undefined1 local_9ec1 [104];
  allocator<char> local_9e59;
  string local_9e58 [103];
  allocator<char> local_9df1;
  string local_9df0 [103];
  allocator<char> local_9d89;
  string local_9d88 [103];
  allocator<char> local_9d21;
  string local_9d20 [103];
  allocator<char> local_9cb9;
  string local_9cb8 [103];
  allocator<char> local_9c51;
  string local_9c50 [17664];
  string local_5750 [32];
  string local_5730 [39];
  allocator<char> local_5709;
  string local_5708 [103];
  allocator<char> local_56a1;
  string local_56a0 [103];
  undefined1 local_5639 [104];
  undefined1 local_55d1 [104];
  allocator<char> local_5569;
  string local_5568 [103];
  allocator<char> local_5501;
  string local_5500 [103];
  allocator<char> local_5499;
  string local_5498 [103];
  allocator<char> local_5431;
  string local_5430 [103];
  allocator<char> local_53c9;
  string local_53c8 [103];
  allocator<char> local_5361;
  string local_5360 [103];
  allocator<char> local_52f9;
  string local_52f8 [103];
  allocator<char> local_5291;
  string local_5290 [103];
  allocator<char> local_5229;
  string local_5228 [103];
  allocator<char> local_51c1;
  string local_51c0 [103];
  undefined1 local_5159 [104];
  undefined1 local_50f1 [104];
  allocator<char> local_5089;
  string local_5088 [103];
  allocator<char> local_5021;
  string local_5020 [103];
  allocator<char> local_4fb9;
  string local_4fb8 [17671];
  allocator<char> local_ab1;
  string local_ab0 [103];
  allocator<char> local_a49;
  string local_a48 [103];
  allocator<char> local_9e1;
  string local_9e0 [103];
  allocator<char> local_979;
  string local_978 [864];
  string local_618 [32];
  string local_5f8 [39];
  allocator<char> local_5d1;
  string local_5d0 [103];
  undefined1 local_569 [104];
  undefined1 local_501 [104];
  allocator<char> local_499;
  string local_498 [896];
  string local_118 [32];
  PositiveConstraint local_f8 [2];
  string local_b8 [32];
  PositiveConstraint local_98 [2];
  string local_58 [48];
  PositiveConstraint local_28;
  
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1d8));
  if (!bVar1) {
    isPositive();
    in_stack_ffffffffffff5658 =
         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
          *)Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x1d8));
    in_stack_ffffffffffff5657 =
         PositiveConstraint::operator()(&local_28,(double)in_stack_ffffffffffff5658);
    in_stack_ffffffffffff5656 = in_stack_ffffffffffff5657 ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x3a71bb);
    if ((in_stack_ffffffffffff5656 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1d8));
      uVar2 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff5438);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_58);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x3a7267);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x640));
  if (!bVar1) {
    isPositive();
    data = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0x640));
    bVar1 = PositiveConstraint::operator()(local_98,data);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x3a735e);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x640));
      uVar2 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff5438);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_b8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x3a740a);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x670));
  if (!bVar1) {
    isPositive();
    data_00 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x670));
    bVar1 = PositiveConstraint::operator()(local_f8,data_00);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x3a7505);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x670));
      uVar2 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffff5438);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_118);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x3a75b1);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x138));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    in_stack_ffffffffffff55f8 =
         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
          *)local_501;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff54d8,in_stack_ffffffffffff54d0);
    in_stack_ffffffffffff55f0 =
         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5538,in_stack_ffffffffffff5530);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5598,in_stack_ffffffffffff5590);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffff5438);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff54c8,in_stack_ffffffffffff54c0);
    std::__cxx11::string::~string(local_5f8);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string((string *)(local_569 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_569);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string((string *)(local_501 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_501);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_498);
    std::allocator<char>::~allocator(&local_499);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x138));
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff54d8,in_stack_ffffffffffff54d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5538,in_stack_ffffffffffff5530);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5598,in_stack_ffffffffffff5590);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff5438);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_618);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_ab0);
      std::allocator<char>::~allocator(&local_ab1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a48);
      std::allocator<char>::~allocator(&local_a49);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_9e0);
      std::allocator<char>::~allocator(&local_9e1);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator(&local_979);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x188));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff54d8,in_stack_ffffffffffff54d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5538,in_stack_ffffffffffff5530);
    pPVar4 = (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              *)local_50f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(pPVar4,in_stack_ffffffffffff5590);
    cons2 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_5159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff55f8,in_stack_ffffffffffff55f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5658,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_ffffffffffff5657,
                                CONCAT16(in_stack_ffffffffffff5656,in_stack_ffffffffffff5650)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff56b8,in_stack_ffffffffffff56b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5718,in_stack_ffffffffffff5710);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5778,in_stack_ffffffffffff5770);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff57d8,in_stack_ffffffffffff57d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5838,in_stack_ffffffffffff5830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5898,in_stack_ffffffffffff5890);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff58f8,in_stack_ffffffffffff58f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5958,in_stack_ffffffffffff5950);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff59b8,in_stack_ffffffffffff59b0);
    in_stack_ffffffffffff5538 =
         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
          *)local_55d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5a18,in_stack_ffffffffffff5a10);
    in_stack_ffffffffffff5530 =
         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_5639;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5a78,in_stack_ffffffffffff5a70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5ad8,in_stack_ffffffffffff5ad0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,in_stack_ffffffffffff5470
              );
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5b38,in_stack_ffffffffffff5b30);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffff5438);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()(in_stack_ffffffffffff54c8,in_stack_ffffffffffff54c0);
    std::__cxx11::string::~string(local_5730);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5708);
    std::allocator<char>::~allocator(&local_5709);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_56a0);
    std::allocator<char>::~allocator(&local_56a1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string((string *)(local_5639 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5639);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string((string *)(local_55d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_55d1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5568);
    std::allocator<char>::~allocator(&local_5569);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5500);
    std::allocator<char>::~allocator(&local_5501);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5498);
    std::allocator<char>::~allocator(&local_5499);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5430);
    std::allocator<char>::~allocator(&local_5431);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_53c8);
    std::allocator<char>::~allocator(&local_53c9);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5360);
    std::allocator<char>::~allocator(&local_5361);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_52f8);
    std::allocator<char>::~allocator(&local_52f9);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5290);
    std::allocator<char>::~allocator(&local_5291);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5228);
    std::allocator<char>::~allocator(&local_5229);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_51c0);
    std::allocator<char>::~allocator(&local_51c1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string((string *)(local_5159 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5159);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string((string *)(local_50f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_50f1);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5088);
    std::allocator<char>::~allocator(&local_5089);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_5020);
    std::allocator<char>::~allocator(&local_5021);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_4fb8);
    std::allocator<char>::~allocator(&local_4fb9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x188));
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff54d8,in_stack_ffffffffffff54d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5538,in_stack_ffffffffffff5530);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(pPVar4,cons2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff55f8,in_stack_ffffffffffff55f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5658,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_ffffffffffff5657,
                                  CONCAT16(in_stack_ffffffffffff5656,in_stack_ffffffffffff5650)));
      in_stack_ffffffffffff54d8 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_9ec1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff56b8,in_stack_ffffffffffff56b0);
      in_stack_ffffffffffff54d0 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_9f29;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5718,in_stack_ffffffffffff5710);
      in_stack_ffffffffffff54c8 =
           (OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
            *)local_9f91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5778,in_stack_ffffffffffff5770);
      in_stack_ffffffffffff54c0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9ff9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff57d8,in_stack_ffffffffffff57d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5838,in_stack_ffffffffffff5830);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5898,in_stack_ffffffffffff5890);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff58f8,in_stack_ffffffffffff58f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5958,in_stack_ffffffffffff5950);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff59b8,in_stack_ffffffffffff59b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5a18,in_stack_ffffffffffff5a10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5a78,in_stack_ffffffffffff5a70);
      in_stack_ffffffffffff5480 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a339;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5ad8,in_stack_ffffffffffff5ad0);
      in_stack_ffffffffffff5478 = (string *)local_a3a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,
                 in_stack_ffffffffffff5470);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5b38,in_stack_ffffffffffff5b30);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffff5438);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_5750);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string((string *)(local_a3a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_a3a1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string((string *)(local_a339 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_a339);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a2d0);
      std::allocator<char>::~allocator(&local_a2d1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a268);
      std::allocator<char>::~allocator(&local_a269);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a200);
      std::allocator<char>::~allocator(&local_a201);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a198);
      std::allocator<char>::~allocator(&local_a199);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a130);
      std::allocator<char>::~allocator(&local_a131);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a0c8);
      std::allocator<char>::~allocator(&local_a0c9);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_a060);
      std::allocator<char>::~allocator(&local_a061);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string((string *)(local_9ff9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_9ff9);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string((string *)(local_9f91 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_9f91);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string((string *)(local_9f29 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_9f29);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string((string *)(local_9ec1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_9ec1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_9e58);
      std::allocator<char>::~allocator(&local_9e59);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_9df0);
      std::allocator<char>::~allocator(&local_9df1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_9d88);
      std::allocator<char>::~allocator(&local_9d89);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_9d20);
      std::allocator<char>::~allocator(&local_9d21);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff5440);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_9cb8);
      std::allocator<char>::~allocator(&local_9cb9);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
      std::__cxx11::string::~string(local_9c50);
      std::allocator<char>::~allocator(&local_9c51);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x6f8));
  if (!bVar1) {
    __a = &local_a5a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,__a);
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,__a);
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff54d8,in_stack_ffffffffffff54d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,__a);
    isEqualIgnoreCase(in_stack_ffffffffffff5478);
    OpenMD::operator||(in_stack_ffffffffffff5538,in_stack_ffffffffffff5530);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffff5438);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffff54c8,in_stack_ffffffffffff54c0);
    std::__cxx11::string::~string(local_a6a0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_a678);
    std::allocator<char>::~allocator(&local_a679);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffff5440);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_a610);
    std::allocator<char>::~allocator(&local_a611);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffff5440);
    std::__cxx11::string::~string(local_a5a8);
    std::allocator<char>::~allocator(&local_a5a9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x6f8));
      uVar2 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,__a);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      this_00 = (OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                 *)&local_a929;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,__a);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff54d8,in_stack_ffffffffffff54d0);
      pPVar4 = (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                *)local_a991;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffff5480,(char *)in_stack_ffffffffffff5478,__a);
      isEqualIgnoreCase(in_stack_ffffffffffff5478);
      OpenMD::operator||(in_stack_ffffffffffff5538,in_stack_ffffffffffff5530);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_(pPVar4);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_a6c0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(this_00);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)this_00);
      std::__cxx11::string::~string((string *)(local_a991 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_a991);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)this_00);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)this_00);
      std::__cxx11::string::~string(local_a928);
      std::allocator<char>::~allocator(&local_a929);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)this_00);
      std::__cxx11::string::~string(local_a8c0);
      std::allocator<char>::~allocator(&local_a8c1);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void RNEMDParameters::validate() {
    CheckParameter(ExchangeTime, isPositive());
    CheckParameter(OutputBins, isPositive());
    CheckParameter(OutputBinWidth, isPositive());
    CheckParameter(Method,
                   isEqualIgnoreCase("Swap") || isEqualIgnoreCase("NIVS") ||
                       isEqualIgnoreCase("VSS") || isEqualIgnoreCase("SPF"));
    CheckParameter(
        FluxType,
        isEqualIgnoreCase("KE") || isEqualIgnoreCase("Px") ||
            isEqualIgnoreCase("Py") || isEqualIgnoreCase("Pz") ||
            isEqualIgnoreCase("Lx") || isEqualIgnoreCase("Ly") ||
            isEqualIgnoreCase("Lz") || isEqualIgnoreCase("Pvector") ||
            isEqualIgnoreCase("Lvector") || isEqualIgnoreCase("KE+Px") ||
            isEqualIgnoreCase("KE+Py") || isEqualIgnoreCase("KE+Lx") ||
            isEqualIgnoreCase("KE+Ly") || isEqualIgnoreCase("KE+Lz") ||
            isEqualIgnoreCase("KE+Pvector") ||
            isEqualIgnoreCase("KE+Lvector") || isEqualIgnoreCase("Particle") ||
            isEqualIgnoreCase("Particle+KE") ||
            isEqualIgnoreCase("CurrentDensity"));
    CheckParameter(PrivilegedAxis, isEqualIgnoreCase("x") ||
                                       isEqualIgnoreCase("y") ||
                                       isEqualIgnoreCase("z"));
  }